

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::syncCalendarWidget(QDateTimeEditPrivate *this)

{
  long lVar1;
  QDate min;
  QDate in_RDI;
  long in_FS_OFFSET;
  QDateTimeEdit *q;
  QSignalBlocker blocker;
  QCalendarPopup *this_00;
  QCalendarPopup *this_01;
  QDate in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func((QDateTimeEditPrivate *)in_RDI.jd);
  if (((QDateTimeEditPrivate *)in_RDI.jd)->monthCalendar != (QCalendarPopup *)0x0) {
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)in_stack_ffffffffffffffc0.jd,(QObject *)in_RDI.jd);
    this_00 = ((QDateTimeEditPrivate *)in_RDI.jd)->monthCalendar;
    QDateTimeEdit::minimumDate((QDateTimeEdit *)this_00);
    min = QDateTimeEdit::maximumDate((QDateTimeEdit *)this_00);
    QCalendarPopup::setDateRange(this_00,min,in_stack_ffffffffffffffc0);
    this_01 = ((QDateTimeEditPrivate *)in_RDI.jd)->monthCalendar;
    QDateTimeEdit::date((QDateTimeEdit *)this_00);
    QCalendarPopup::setDate(this_00,in_RDI);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::syncCalendarWidget()
{
    Q_Q(QDateTimeEdit);
    if (monthCalendar) {
        const QSignalBlocker blocker(monthCalendar);
        monthCalendar->setDateRange(q->minimumDate(), q->maximumDate());
        monthCalendar->setDate(q->date());
    }
}